

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_ObjectArray<ON_Layer> *a)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int count;
  int local_34;
  ON_Layer *local_30;
  
  ON_ClassArray<ON_Layer>::Empty((ON_ClassArray<ON_Layer> *)a);
  bVar1 = ReadInt32(this,1,&local_34);
  if ((bVar1) &&
     (ON_ClassArray<ON_Layer>::SetCapacity((ON_ClassArray<ON_Layer> *)a,(long)local_34),
     bVar1 && 0 < local_34)) {
    iVar3 = 1;
    while( true ) {
      local_30 = ON_ClassArray<ON_Layer>::AppendNew((ON_ClassArray<ON_Layer> *)a);
      iVar2 = ReadObjectHelper(this,(ON_Object **)&local_30);
      bVar1 = iVar2 == 1;
      if (!bVar1) break;
      if (local_34 <= iVar3) {
        return bVar1;
      }
      iVar3 = iVar3 + 1;
    }
    ON_ClassArray<ON_Layer>::Remove((ON_ClassArray<ON_Layer> *)a,*(int *)(a + 0x10) + -1);
  }
  return bVar1;
}

Assistant:

bool ON_BinaryArchive::ReadArray( ON_ObjectArray<class ON_Layer>& a)
{
  a.Empty();
  int i, count;
  bool rc = ReadInt( &count );
  if (rc)
  {
    a.SetCapacity(count);
    for  ( i = 0; i < count && rc; i++ )
    {
      rc = (1 == ReadObject(a.AppendNew()));
      if (!rc)
      {
        a.Remove();
        break;
      }
    }
  }
  return rc;
}